

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRocket_dns.c
# Opt level: O3

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  
  dVar4 = 0.0;
  if (*user_data != 0) {
    dVar4 = 2200.0 / (t * -0.1 + 11.0);
  }
  lVar2 = N_VGetArrayPointer();
  pdVar3 = (double *)N_VGetArrayPointer(ydot);
  dVar1 = *(double *)(lVar2 + 8);
  *pdVar3 = dVar1;
  pdVar3[1] = dVar1 * -0.3 + dVar4 + -32.0;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype v, acc;
  sunbooleantype engine_on;
  sunrealtype *ydata, *yddata;

  engine_on = *((sunbooleantype*)user_data);
  ydata     = N_VGetArrayPointer(y);
  yddata    = N_VGetArrayPointer(ydot);

  v         = ydata[1];
  yddata[0] = v;

  acc = engine_on ? Force / (massr + massf0 - brate * t) : ZERO;

  yddata[1] = acc - Drag * v - grav;

  return (0);
}